

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O0

void wrtsep(FILE *out,char fill,char *title,int nchar)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  int local_40;
  int i;
  int first_end;
  char *p;
  char *line;
  int ntitle;
  int nchar_local;
  char *title_local;
  char fill_local;
  FILE *out_local;
  
  sVar3 = strlen(title);
  iVar1 = (int)sVar3;
  line._4_4_ = nchar;
  if (nchar < iVar1) {
    line._4_4_ = iVar1;
  }
  if (0 < line._4_4_) {
    __dest = (char *)malloc((long)(line._4_4_ + 1));
    _i = __dest;
    if (iVar1 < 1) {
      for (local_40 = 0; local_40 < line._4_4_; local_40 = local_40 + 1) {
        *_i = fill;
        _i = _i + 1;
      }
      *_i = '\0';
    }
    else {
      iVar2 = (line._4_4_ - iVar1) / 2;
      for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
        *_i = fill;
        _i = _i + 1;
      }
      *_i = '\0';
      strcat(__dest,title);
      _i = _i + iVar1;
      for (local_40 = iVar2 + iVar1; local_40 < line._4_4_; local_40 = local_40 + 1) {
        *_i = fill;
        _i = _i + 1;
      }
      *_i = '\0';
    }
    if (out != (FILE *)0x0) {
      fprintf((FILE *)out,"%s\n",__dest);
    }
    if (out == _stdout) {
      fflush((FILE *)out);
    }
    free(__dest);
  }
  return;
}

Assistant:

void wrtsep(FILE *out,char fill, char *title, int nchar)
/* print a line of char fill with string title in the middle */
{
    int ntitle; 
    char *line; 
    char *p;
    int first_end;
    int i = 0;

    ntitle = strlen(title); 
    if(ntitle > nchar) nchar = ntitle;
    if(nchar <= 0) return; 
    line = (char *)malloc((nchar+1)*sizeof(char)); 
    p = line;
    if(ntitle < 1) { 
        for (i=0; i < nchar; i++) {*p = fill; p++;}	
	*p = '\0';
    }
    else { 
	first_end = ( nchar - ntitle)/2; 
	for (i = 0; i < first_end; i++) { *p = fill; p++;}
	*p = '\0';
	strcat(line, title);
	p += ntitle;
        for( i = first_end + ntitle; i < nchar; i++) {*p = fill; p++;}
	*p = '\0';
    }
    if(out != NULL )fprintf(out,"%s\n",line);
    if(out == stdout )fflush(out);
    free (line);
    return ;
}